

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O3

void __thiscall
duckdb::CardinalityEstimator::InitEquivalentRelations
          (CardinalityEstimator *this,
          vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_true>
          *filter_infos)

{
  pointer puVar1;
  JoinRelationSet *pJVar2;
  _Head_base<0UL,_duckdb::FilterInfo_*,_false> filter_info;
  type pFVar3;
  pointer this_00;
  vector<unsigned_long,_true> matching_equivalent_sets;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  this_00 = (filter_infos->
            super_vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (filter_infos->
           super_vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != puVar1) {
    do {
      pFVar3 = unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>::
               operator*(this_00);
      pJVar2 = (pFVar3->right_set).ptr;
      if ((pFVar3->left_set).ptr == (JoinRelationSet *)0x0) {
        if (pJVar2 != (JoinRelationSet *)0x0) goto LAB_00cfe30d;
LAB_00cfe32b:
        pFVar3 = unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>::
                 operator*(this_00);
        if ((pFVar3->right_set).ptr != (JoinRelationSet *)0x0 ||
            (pFVar3->left_set).ptr != (JoinRelationSet *)0x0) {
          DetermineMatchingEquivalentSets
                    ((vector<unsigned_long,_true> *)&local_48,this,
                     (optional_ptr<duckdb::FilterInfo,_true>)
                     (this_00->
                     super_unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>_>)
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::FilterInfo_*,_std::default_delete<duckdb::FilterInfo>_>
                     .super__Head_base<0UL,_duckdb::FilterInfo_*,_false>._M_head_impl);
          filter_info._M_head_impl =
               (this_00->
               super_unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>_>)._M_t.
               super___uniq_ptr_impl<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::FilterInfo_*,_std::default_delete<duckdb::FilterInfo>_>
               .super__Head_base<0UL,_duckdb::FilterInfo_*,_false>._M_head_impl;
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_60,&local_48);
          AddToEquivalenceSets
                    (this,(optional_ptr<duckdb::FilterInfo,_true>)filter_info._M_head_impl,
                     (vector<unsigned_long,_true> *)&local_60);
          if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      else {
        if ((pJVar2 != (JoinRelationSet *)0x0) && (1 < ((pFVar3->set)._M_data)->count))
        goto LAB_00cfe32b;
LAB_00cfe30d:
        if (0xfd < (byte)(pFVar3->join_type - MARK)) goto LAB_00cfe32b;
        pFVar3 = unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>::
                 operator*(this_00);
        AddRelationTdom(this,pFVar3);
      }
      this_00 = this_00 + 1;
    } while (this_00 != puVar1);
  }
  RemoveEmptyTotalDomains(this);
  return;
}

Assistant:

void CardinalityEstimator::InitEquivalentRelations(const vector<unique_ptr<FilterInfo>> &filter_infos) {
	// For each filter, we fill keep track of the index of the equivalent relation set
	// the left and right relation needs to be added to.
	for (auto &filter : filter_infos) {
		if (SingleColumnFilter(*filter)) {
			// Filter on one relation, (i.e. string or range filter on a column).
			// Grab the first relation and add it to  the equivalence_relations
			AddRelationTdom(*filter);
			continue;
		} else if (EmptyFilter(*filter)) {
			continue;
		}
		D_ASSERT(filter->left_set->count >= 1);
		D_ASSERT(filter->right_set->count >= 1);

		auto matching_equivalent_sets = DetermineMatchingEquivalentSets(filter.get());
		AddToEquivalenceSets(filter.get(), matching_equivalent_sets);
	}
	RemoveEmptyTotalDomains();
}